

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

EdgeBool * __thiscall
indigox::utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
GetEdge(EdgeBool *__return_storage_ptr__,
       Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph> *this,
       VertType u,VertType v)

{
  long lVar1;
  long lVar2;
  property_type *ppVar3;
  long lVar4;
  bool bVar5;
  
  lVar1 = (long)u + 8;
  lVar2 = lVar1;
  for (lVar4 = *(long *)((long)u + 0x10); lVar4 != 0;
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)bVar5 * 8)) {
    bVar5 = *(VertType *)(lVar4 + 0x20) < v;
    if (!bVar5) {
      lVar2 = lVar4;
    }
  }
  lVar4 = lVar1;
  if ((lVar2 != lVar1) && (lVar4 = lVar2, v < *(VertType *)(lVar2 + 0x20))) {
    lVar4 = lVar1;
  }
  if (lVar4 == lVar1) {
    ppVar3 = (property_type *)0x0;
  }
  else {
    ppVar3 = (property_type *)(*(long *)(lVar4 + 0x28) + 0x20);
  }
  (__return_storage_ptr__->first).super_edge_base<boost::undirected_tag,_void_*>.m_source = u;
  (__return_storage_ptr__->first).super_edge_base<boost::undirected_tag,_void_*>.m_target = v;
  (__return_storage_ptr__->first).m_eproperty = ppVar3;
  __return_storage_ptr__->second = lVar4 != lVar1;
  return __return_storage_ptr__;
}

Assistant:

EdgeBool GetEdge(VertType u, VertType v) const
      {
        return boost::edge(u, v, *graph_);
      }